

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::~thread_pool(thread_pool<(unsigned_char)__x00_> *this)

{
  void *in_RSI;
  thread_pool<(unsigned_char)__x00_> *in_RDI;
  unique_ptr<std::jthread[],_std::default_delete<std::jthread[]>_> *in_stack_fffffffffffffff0;
  
  wait(in_RDI,in_RSI);
  std::unique_ptr<std::jthread[],_std::default_delete<std::jthread[]>_>::~unique_ptr
            (in_stack_fffffffffffffff0);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            *)0x21a82f);
  std::condition_variable::~condition_variable(&in_RDI->tasks_done_cv);
  std::_V2::condition_variable_any::~condition_variable_any((condition_variable_any *)in_RDI);
  std::function<void_(unsigned_long)>::~function((function<void_(unsigned_long)> *)0x21a85c);
  std::function<void_(unsigned_long)>::~function((function<void_(unsigned_long)> *)0x21a866);
  return;
}

Assistant:

~thread_pool() noexcept
    {
#ifdef __cpp_exceptions
        try
        {
#endif
            wait();
#ifndef __cpp_lib_jthread
            destroy_threads();
#endif
#ifdef __cpp_exceptions
        }
        catch (...)
        {
        }
#endif
    }